

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::leaveEvent(QMdiSubWindow *this,QEvent *param_1)

{
  int iVar1;
  int iVar2;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar3;
  int iVar4;
  long in_FS_OFFSET;
  QRegion QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (this_00->hoveredSubControl != SC_None) {
    this_00->hoveredSubControl = SC_None;
    pQVar3 = (this->super_QWidget).data;
    iVar1 = (pQVar3->crect).x2.m_i;
    iVar2 = (pQVar3->crect).x1.m_i;
    iVar4 = QMdiSubWindowPrivate::titleBarHeight(this_00);
    QRegion::QRegion(&QStack_28,0,0,(iVar1 - iVar2) + 1,iVar4,Rectangle);
    QWidget::update(&this->super_QWidget,&QStack_28);
    QRegion::~QRegion(&QStack_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::leaveEvent(QEvent * /*leaveEvent*/)
{
    Q_D(QMdiSubWindow);
    if (d->hoveredSubControl != QStyle::SC_None) {
        d->hoveredSubControl = QStyle::SC_None;
        update(QRegion(0, 0, width(), d->titleBarHeight()));
    }
}